

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_list.cpp
# Opt level: O1

OpenFileInfo * __thiscall
duckdb::GlobMultiFileList::GetFile
          (OpenFileInfo *__return_storage_ptr__,GlobMultiFileList *this,idx_t i)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->lock);
  if (iVar1 == 0) {
    GetFileInternal(__return_storage_ptr__,this,i);
    pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
    return __return_storage_ptr__;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

OpenFileInfo GlobMultiFileList::GetFile(idx_t i) {
	lock_guard<mutex> lck(lock);
	return GetFileInternal(i);
}